

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

void __thiscall Cache::initCache(Cache *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  pointer pBVar2;
  uint32_t j;
  uint uVar3;
  int **ppiVar4;
  int *piVar5;
  ulong uVar6;
  uint64_t **ppuVar7;
  uint64_t *puVar8;
  ulong uVar9;
  uint32_t i_1;
  uint32_t i;
  ulong uVar10;
  uint uVar11;
  allocator_type local_49;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::vector
            ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)&local_48,
             (ulong)(this->policy).block_num,&local_49);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::_M_move_assign(&this->blocks,&local_48);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector
            ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)&local_48);
  uVar3 = 0;
  while( true ) {
    pBVar2 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->blocks).
                       super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pBVar2) / 0x30) <= (ulong)uVar3)
    break;
    uVar11 = (this->policy).block_size;
    pvVar1 = &pBVar2[uVar3].data;
    ((Block *)(pvVar1 + -1))->size = uVar11;
    ((Block *)(pvVar1 + -1))->id = uVar3 / (this->policy).associativity;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(ulong)uVar11,
               (allocator_type *)&local_49);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(pvVar1,&local_48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    uVar3 = uVar3 + 1;
  }
  uVar3 = (this->policy).block_num;
  uVar11 = (this->policy).associativity;
  ppiVar4 = (int **)operator_new__(((ulong)uVar3 / (ulong)uVar11) * 8);
  this->plru_bit = ppiVar4;
  for (uVar10 = 0; uVar6 = (ulong)uVar3 / (ulong)uVar11, uVar10 < uVar6; uVar10 = uVar10 + 1) {
    piVar5 = (int *)operator_new__((ulong)uVar11 << 2);
    ppiVar4[uVar10] = piVar5;
    ppiVar4 = this->plru_bit;
    for (uVar6 = 0; uVar6 < uVar11; uVar6 = uVar6 + 1) {
      ppiVar4[uVar10][uVar6] = 0;
      uVar11 = (this->policy).associativity;
    }
    uVar3 = (this->policy).block_num;
  }
  ppuVar7 = (uint64_t **)operator_new__(uVar6 * 8);
  this->mct = ppuVar7;
  uVar3 = this->mct_size;
  for (uVar10 = 0; uVar10 < uVar6; uVar10 = uVar10 + 1) {
    puVar8 = (uint64_t *)operator_new__((ulong)uVar3 * 8);
    ppuVar7[uVar10] = puVar8;
    ppuVar7 = this->mct;
    for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
      ppuVar7[uVar10][uVar9] = 0xffffffffffffffff;
    }
  }
  return;
}

Assistant:

void Cache::initCache() {
    this->blocks = std::vector<Block>(policy.block_num);
    for (uint32_t i = 0; i < this->blocks.size(); i++) {
        Block &b = this->blocks[i];
        b.size = policy.block_size;
        b.id = i / policy.associativity;
        b.data = std::vector<uint8_t>(b.size);
    }
    this->plru_bit = new int *[this->policy.block_num / this->policy.associativity];
    for (uint32_t i = 0; i < this->policy.block_num / this->policy.associativity; i++) {
        this->plru_bit[i] = new int[this->policy.associativity];
        for (uint32_t j = 0; j < this->policy.associativity; j++) {
            this->plru_bit[i][j] = 0;
        }
    }
    this->mct = new uint64_t *[this->policy.block_num / this->policy.associativity];
    for (uint32_t i = 0; i < this->policy.block_num / this->policy.associativity; i++) {
        this->mct[i] = new uint64_t[this->mct_size];
        for (uint32_t j = 0; j < this->mct_size; j++) {
            this->mct[i][j] = (uint64_t) -1;
        }
    }

}